

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

void update_minimap_subwindow(game_event_type type,game_event_data *data,void *user)

{
  term *t;
  int16_t iVar1;
  
  iVar1 = player_resting_count(player);
  t = Term;
  if ((iVar1 == 0) && (player->upkeep->running == L'\0')) {
    if (type == EVENT_DUNGEONLEVEL) {
      if ((cave->height <= angband_term[*user]->hgt + -2) ||
         (cave->width <= angband_term[*user]->wid + -2)) {
        *(undefined1 *)((long)user + 4) = 1;
      }
    }
    else if (type == EVENT_END) {
      Term_activate(angband_term[*user]);
      if (*(char *)((long)user + 4) == '\x01') {
        Term_clear();
      }
      display_map((int *)0x0,(int *)0x0);
      Term_fresh();
      Term_activate(t);
      *(undefined1 *)((long)user + 4) = 0;
    }
  }
  return;
}

Assistant:

static void update_minimap_subwindow(game_event_type type,
	game_event_data *data, void *user)
{
	struct minimap_flags *flags = user;

	if (player_resting_count(player) || player->upkeep->running) return;

	if (type == EVENT_END) {
		term *old = Term;
		term *t = angband_term[flags->win_idx];

		/* Activate */
		Term_activate(t);

		/* If whole-map redraw, clear window first. */
		if (flags->needs_redraw)
			Term_clear();

		/* Redraw map */
		display_map(NULL, NULL);
		Term_fresh();

		/* Restore */
		Term_activate(old);

		flags->needs_redraw = false;
	} else if (type == EVENT_DUNGEONLEVEL) {
		/* XXX map_height and map_width need to be kept in sync with
		 * display_map() */
		term *t = angband_term[flags->win_idx];
		int map_height = t->hgt - 2;
		int map_width = t->wid - 2;

		/* Clear the entire term if the new map isn't going to fit the
		 * entire thing */
		if (cave->height <= map_height || cave->width <= map_width) {
			flags->needs_redraw = true;
		}
	}
}